

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O2

LispPTR LCFetchMethod(LispPTR class,LispPTR selector)

{
  LispPTR *pLVar1;
  long lVar2;
  LispPTR LAddr;
  LispPTR LVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  if (atom_instance == 0) {
    LCinit();
  }
  uVar7 = (ulong)(((selector ^ class) & 0x3ff) << 4);
  pLVar1 = (LispPTR *)((long)&LCMethodCache->class + uVar7);
  if ((*(LispPTR *)((long)&LCMethodCache->class + uVar7) == class) && (pLVar1[1] == selector)) {
    LVar3 = pLVar1[2];
  }
  else {
    uVar6 = *(ushort *)((ulong)(class >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if ((*(uint *)((long)DTDspace + (ulong)uVar6 * 4 + (ulong)(uVar6 << 5)) & 0xfffffff) ==
        atom_class) {
      pLVar4 = NativeAligned4FromLAddr(class);
      LVar3 = pLVar4[8];
      LAddr = class;
      while( true ) {
        pLVar4 = NativeAligned4FromLAddr(LAddr);
        if (pLVar4[0xb] != 0) {
          pLVar5 = NativeAligned4FromLAddr(pLVar4[0xb]);
          lVar2 = 0;
          while (lVar8 = lVar2, *(LispPTR *)((long)pLVar5 + lVar8) != 0) {
            lVar2 = lVar8 + 4;
            if (*(LispPTR *)((long)pLVar5 + lVar8) == selector) {
              *pLVar1 = class;
              pLVar1[1] = selector;
              pLVar4 = NativeAligned4FromLAddr(pLVar4[0xc]);
              LVar3 = *(LispPTR *)((long)pLVar4 + lVar8);
              pLVar1[2] = LVar3;
              return LVar3;
            }
          }
        }
        LAddr = car(LVar3);
        if (LAddr == 0) break;
        LVar3 = cdr(LVar3);
      }
      LVar3 = 0;
    }
    else {
      lcfuncall(atom_FetchMethod_LCUFN,2,3);
      LVar3 = 0xfffffffe;
    }
  }
  return LVar3;
}

Assistant:

LispPTR LCFetchMethod(LispPTR class, LispPTR selector) {
  struct LCMethodCacheEntry *ce;

  LC_INIT;

  /* Check cache before doing type check */
  ce = &(LCMethodCache[METH_CACHE_INDEX(class, selector)]);
  if (ce->class == class && ce->selector == selector) return ce->method_fn;

  /* it wasn't there, go search class then supers */

  if (!LC_TYPEP(class, atom_class)) RETCALL(atom_FetchMethod_LCUFN, 2);
  {
    LispPTR cur_class = class;
    LispPTR supers = ((struct LCClass *)NativeAligned4FromLAddr(cur_class))->supers;

    for (;;) {
      int i = 0;
      LispPTR val;
      struct LCClass *classptr;
      LispPTR *selectorptr;

      classptr = (struct LCClass *)NativeAligned4FromLAddr(cur_class);
      if (classptr->selectors == NIL_PTR)
        goto next_class;
      else
        selectorptr = (LispPTR *)NativeAligned4FromLAddr(classptr->selectors);

      while ((val = selectorptr[i++]) != NIL_PTR) {
        if (val == selector) {
          ce->class = class;
          ce->selector = selector;
          return (ce->method_fn = ((LispPTR *)NativeAligned4FromLAddr(classptr->methods))[i - 1]);
        }
      }

    next_class:
      if ((cur_class = car(supers)) == NIL_PTR) break;
      supers = cdr(supers);
    }
  }

  /* we didn't find it at all; return NIL */
  return NIL_PTR;
}